

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt_wallet_tests.cpp
# Opt level: O2

void __thiscall wallet::psbt_wallet_tests::parse_hd_keypath::test_method(parse_hd_keypath *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  check_type cVar4;
  char *local_968;
  char *local_960;
  undefined1 *local_958;
  undefined1 *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  undefined1 *local_898;
  undefined1 *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  undefined1 *local_7d8;
  undefined1 *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  undefined1 *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  undefined1 *local_6b8;
  undefined1 *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  lazy_ostream local_d8;
  undefined1 *local_c8;
  char **local_c0;
  allocator<char> local_b1;
  assertion_result local_b0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> keypath;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  keypath.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keypath.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keypath.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x57;
  file.m_begin = (iterator)&local_88;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1",&local_b1
            );
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_f8,0x57);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = &DAT_00000058;
  file_00.m_begin = (iterator)&local_108;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
             msg_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"///////////////////////////",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"///////////////////////////\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_120 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_128,0x58);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5a;
  file_01.m_begin = (iterator)&local_138;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_148,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\'/1",
             &local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "ParseHDKeypath(\"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\'/1\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_150 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_158,0x5a);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5b;
  file_02.m_begin = (iterator)&local_168;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_178,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"//////////////////////////\'/",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"//////////////////////////\'/\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_180 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_188,0x5b);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5d;
  file_03.m_begin = (iterator)&local_198;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a8,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/",&local_b1)
  ;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_1b0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_1b8,0x5d);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5e;
  file_04.m_begin = (iterator)&local_1c8;
  msg_04.m_end = pvVar3;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d8,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1///////////////////////////",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"1///////////////////////////\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_1e0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_1e8,0x5e);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x60;
  file_05.m_begin = (iterator)&local_1f8;
  msg_05.m_end = pvVar3;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_208,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\'/",
             &local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\'/\", keypath)"
  ;
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_210 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_218,0x60);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x61;
  file_06.m_begin = (iterator)&local_228;
  msg_06.m_end = pvVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_238,
             msg_06);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1/\'//////////////////////////",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"1/\'//////////////////////////\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_240 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_248,0x61);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x63;
  file_07.m_begin = (iterator)&local_258;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_268,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_270 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_278,99);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x64;
  file_08.m_begin = (iterator)&local_288;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_298,
             msg_08);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58," ",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\" \", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_2a0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_2a8,100);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x66;
  file_09.m_begin = (iterator)&local_2b8;
  msg_09.m_end = pvVar3;
  msg_09.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2c8,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"0",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"0\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_2d0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_2d8,0x66);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x67;
  file_10.m_begin = (iterator)&local_2e8;
  msg_10.m_end = pvVar3;
  msg_10.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2f8,
             msg_10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"O",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"O\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_300 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_308,0x67);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x69;
  file_11.m_begin = (iterator)&local_318;
  msg_11.m_end = pvVar3;
  msg_11.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_328,
             msg_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000\'/0000\'/0000\'",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"0000\'/0000\'/0000\'\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_330 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_338,0x69);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x6a;
  file_12.m_begin = (iterator)&local_348;
  msg_12.m_end = pvVar3;
  msg_12.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_358,
             msg_12);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000,/0000,/0000,",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"0000,/0000,/0000,\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_360 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_368,0x6a);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x6c;
  file_13.m_begin = (iterator)&local_378;
  msg_13.m_end = pvVar3;
  msg_13.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_388,
             msg_13);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"01234",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"01234\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_390 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_398,0x6c);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x6d;
  file_14.m_begin = (iterator)&local_3a8;
  msg_14.m_end = pvVar3;
  msg_14.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3b8,
             msg_14);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"0x1234",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"0x1234\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_3c0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_3c8,0x6d);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x6f;
  file_15.m_begin = (iterator)&local_3d8;
  msg_15.m_end = pvVar3;
  msg_15.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3e8,
             msg_15);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"1",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"1\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_3f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_3f8,0x6f);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x70;
  file_16.m_begin = (iterator)&local_408;
  msg_16.m_end = pvVar3;
  msg_16.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_418,
             msg_16);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58," 1",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\" 1\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_420 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_428,0x70);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x72;
  file_17.m_begin = (iterator)&local_438;
  msg_17.m_end = pvVar3;
  msg_17.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_448,
             msg_17);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"42",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"42\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_450 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_458,0x72);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x73;
  file_18.m_begin = (iterator)&local_468;
  msg_18.m_end = pvVar3;
  msg_18.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_478,
             msg_18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m42",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"m42\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_480 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_488,0x73);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x75;
  file_19.m_begin = (iterator)&local_498;
  msg_19.m_end = pvVar3;
  msg_19.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4a8,
             msg_19);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"4294967295",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"4294967295\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_4b0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_4b8,0x75);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x76;
  file_20.m_begin = (iterator)&local_4c8;
  msg_20.m_end = pvVar3;
  msg_20.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4d8,
             msg_20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"4294967296",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"4294967296\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_4e0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_4e8,0x76);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x78;
  file_21.m_begin = (iterator)&local_4f8;
  msg_21.m_end = pvVar3;
  msg_21.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_508,
             msg_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_510 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_518,0x78);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x79;
  file_22.m_begin = (iterator)&local_528;
  msg_22.m_end = pvVar3;
  msg_22.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_538,
             msg_22);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"n",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"n\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_540 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_548,0x79);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x7b;
  file_23.m_begin = (iterator)&local_558;
  msg_23.m_end = pvVar3;
  msg_23.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_568,
             msg_23);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_570 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_578,0x7b);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x7c;
  file_24.m_begin = (iterator)&local_588;
  msg_24.m_end = pvVar3;
  msg_24.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_598,
             msg_24);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"n/",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"n/\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_5a0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_5a8,0x7c);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x7e;
  file_25.m_begin = (iterator)&local_5b8;
  msg_25.m_end = pvVar3;
  msg_25.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_5c8,
             msg_25);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/0\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_5d0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_5d8,0x7e);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x7f;
  file_26.m_begin = (iterator)&local_5e8;
  msg_26.m_end = pvVar3;
  msg_26.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_5f8,
             msg_26);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"n/0",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"n/0\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_608 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_600 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_608,0x7f);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x81;
  file_27.m_begin = (iterator)&local_618;
  msg_27.m_end = pvVar3;
  msg_27.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_628,
             msg_27);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0\'",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/0\'\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_630 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_638,0x81);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x82;
  file_28.m_begin = (iterator)&local_648;
  msg_28.m_end = pvVar3;
  msg_28.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_658,
             msg_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0\'\'",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"m/0\'\'\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_668 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_660 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_668,0x82);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_670 = "";
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x84;
  file_29.m_begin = (iterator)&local_678;
  msg_29.m_end = pvVar3;
  msg_29.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_688,
             msg_29);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0\'/0\'",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/0\'/0\'\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_690 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_698,0x84);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_6a0 = "";
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x85;
  file_30.m_begin = (iterator)&local_6a8;
  msg_30.m_end = pvVar3;
  msg_30.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_6b8,
             msg_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/\'0/0\'",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"m/\'0/0\'\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_6c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_6c0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_6c8,0x85);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_6d0 = "";
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x87;
  file_31.m_begin = (iterator)&local_6d8;
  msg_31.m_end = pvVar3;
  msg_31.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_6e8,
             msg_31);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0/0",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/0/0\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_6f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_6f0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_6f8,0x87);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_700 = "";
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x88;
  file_32.m_begin = (iterator)&local_708;
  msg_32.m_end = pvVar3;
  msg_32.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_718,
             msg_32);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"n/0/0",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"n/0/0\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_728 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_720 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_728,0x88);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_730 = "";
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x8a;
  file_33.m_begin = (iterator)&local_738;
  msg_33.m_end = pvVar3;
  msg_33.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_748,
             msg_33);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0/0/00",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/0/0/00\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_758 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_750 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_758,0x8a);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x8b;
  file_34.m_begin = (iterator)&local_768;
  msg_34.m_end = pvVar3;
  msg_34.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_778,
             msg_34);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0/0/f00",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"m/0/0/f00\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_788 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_780 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_788,0x8b);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x8d;
  file_35.m_begin = (iterator)&local_798;
  msg_35.m_end = pvVar3;
  msg_35.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_7a8,
             msg_35);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "m/0/0/000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "ParseHDKeypath(\"m/0/0/000000000000000000000000000000000000000000000000000000000000000000000000000000000000\", keypath)"
  ;
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_7b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_7b0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_7b8,0x8d);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_7c0 = "";
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x8e;
  file_36.m_begin = (iterator)&local_7c8;
  msg_36.m_end = pvVar3;
  msg_36.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_7d8,
             msg_36);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "m/1/1/111111111111111111111111111111111111111111111111111111111111111111111111111111111111"
             ,&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "!ParseHDKeypath(\"m/1/1/111111111111111111111111111111111111111111111111111111111111111111111111111111111111\", keypath)"
  ;
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_7e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_7e0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_7e8,0x8e);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_7f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x90;
  file_37.m_begin = (iterator)&local_7f8;
  msg_37.m_end = pvVar3;
  msg_37.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_808,
             msg_37);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0/00/0",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/0/00/0\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_818 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_810 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_818,0x90);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_820 = "";
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x91;
  file_38.m_begin = (iterator)&local_828;
  msg_38.m_end = pvVar3;
  msg_38.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_838,
             msg_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0\'/00/\'0",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"m/0\'/00/\'0\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_848 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_840 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_848,0x91);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_858 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x93;
  file_39.m_begin = (iterator)&local_858;
  msg_39.m_end = pvVar3;
  msg_39.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_868,
             msg_39);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/1/",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/1/\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_878 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_870 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_878,0x93);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_888 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_880 = "";
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x94;
  file_40.m_begin = (iterator)&local_888;
  msg_40.m_end = pvVar3;
  msg_40.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_898,
             msg_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/1//",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"m/1//\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_8a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_8a0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_8a8,0x94);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_8b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x96;
  file_41.m_begin = (iterator)&local_8b8;
  msg_41.m_end = pvVar3;
  msg_41.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_8c8,
             msg_41);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0/4294967295",&local_b1)
  ;
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/0/4294967295\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_8d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_8d0 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_8d8,0x96);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_8e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_8e0 = "";
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x97;
  file_42.m_begin = (iterator)&local_8e8;
  msg_42.m_end = pvVar3;
  msg_42.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_8f8,
             msg_42);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/0/4294967296",&local_b1)
  ;
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"m/0/4294967296\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_908 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_900 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_908,0x97);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_918 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x99;
  file_43.m_begin = (iterator)&local_918;
  msg_43.m_end = pvVar3;
  msg_43.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_928,
             msg_43);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/4294967295",&local_b1);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&keypath);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "ParseHDKeypath(\"m/4294967295\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_938 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_930 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_938,0x99);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  local_948 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_940 = "";
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x9a;
  file_44.m_begin = (iterator)&local_948;
  msg_44.m_end = pvVar3;
  msg_44.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_958,
             msg_44);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"m/4294967296",&local_b1);
  bVar1 = ParseHDKeypath(&local_58,&keypath);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = "!ParseHDKeypath(\"m/4294967296\", keypath)";
  local_e0 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_968 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_960 = "";
  local_c0 = &local_e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d8,1,0,WARN,_cVar4,(size_t)&local_968,0x9a);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&keypath.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_hd_keypath)
{
    std::vector<uint32_t> keypath;

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1", keypath));
    BOOST_CHECK(!ParseHDKeypath("///////////////////////////", keypath));

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1'/1", keypath));
    BOOST_CHECK(!ParseHDKeypath("//////////////////////////'/", keypath));

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/", keypath));
    BOOST_CHECK(!ParseHDKeypath("1///////////////////////////", keypath));

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1'/", keypath));
    BOOST_CHECK(!ParseHDKeypath("1/'//////////////////////////", keypath));

    BOOST_CHECK(ParseHDKeypath("", keypath));
    BOOST_CHECK(!ParseHDKeypath(" ", keypath));

    BOOST_CHECK(ParseHDKeypath("0", keypath));
    BOOST_CHECK(!ParseHDKeypath("O", keypath));

    BOOST_CHECK(ParseHDKeypath("0000'/0000'/0000'", keypath));
    BOOST_CHECK(!ParseHDKeypath("0000,/0000,/0000,", keypath));

    BOOST_CHECK(ParseHDKeypath("01234", keypath));
    BOOST_CHECK(!ParseHDKeypath("0x1234", keypath));

    BOOST_CHECK(ParseHDKeypath("1", keypath));
    BOOST_CHECK(!ParseHDKeypath(" 1", keypath));

    BOOST_CHECK(ParseHDKeypath("42", keypath));
    BOOST_CHECK(!ParseHDKeypath("m42", keypath));

    BOOST_CHECK(ParseHDKeypath("4294967295", keypath)); // 4294967295 == 0xFFFFFFFF (uint32_t max)
    BOOST_CHECK(!ParseHDKeypath("4294967296", keypath)); // 4294967296 == 0xFFFFFFFF (uint32_t max) + 1

    BOOST_CHECK(ParseHDKeypath("m", keypath));
    BOOST_CHECK(!ParseHDKeypath("n", keypath));

    BOOST_CHECK(ParseHDKeypath("m/", keypath));
    BOOST_CHECK(!ParseHDKeypath("n/", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0", keypath));
    BOOST_CHECK(!ParseHDKeypath("n/0", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0'", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/0''", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0'/0'", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/'0/0'", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/0", keypath));
    BOOST_CHECK(!ParseHDKeypath("n/0/0", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/0/00", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/0/0/f00", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/0/000000000000000000000000000000000000000000000000000000000000000000000000000000000000", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/1/1/111111111111111111111111111111111111111111111111111111111111111111111111111111111111", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/00/0", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/0'/00/'0", keypath));

    BOOST_CHECK(ParseHDKeypath("m/1/", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/1//", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/4294967295", keypath)); // 4294967295 == 0xFFFFFFFF (uint32_t max)
    BOOST_CHECK(!ParseHDKeypath("m/0/4294967296", keypath)); // 4294967296 == 0xFFFFFFFF (uint32_t max) + 1

    BOOST_CHECK(ParseHDKeypath("m/4294967295", keypath)); // 4294967295 == 0xFFFFFFFF (uint32_t max)
    BOOST_CHECK(!ParseHDKeypath("m/4294967296", keypath)); // 4294967296 == 0xFFFFFFFF (uint32_t max) + 1
}